

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  byte bVar4;
  ulong uVar5;
  string input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvect;
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvectslice;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  allocator_type local_481;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  long local_478;
  byte local_470 [16];
  void *local_460;
  void *local_458;
  void *local_448;
  void *local_440;
  CyclicHash<unsigned_int,_unsigned_char> local_430;
  
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&local_430,5,0x13);
  local_480._M_current = (char *)local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"ABCDE","");
  bVar4 = (char)local_430.wordsize - 1;
  uVar1 = (local_430.hashvalue >> (bVar4 & 0x1f) | (local_430.mask1 & local_430.hashvalue) * 2) ^
          local_430.hasher.hashvalues[(byte)*local_480._M_current];
  uVar1 = (uVar1 >> (bVar4 & 0x1f) | (uVar1 & local_430.mask1) * 2) ^
          local_430.hasher.hashvalues[(byte)local_480._M_current[1]];
  uVar1 = (uVar1 >> (bVar4 & 0x1f) | (uVar1 & local_430.mask1) * 2) ^
          local_430.hasher.hashvalues[(byte)local_480._M_current[2]];
  local_430.hashvalue =
       (uVar1 >> (bVar4 & 0x1f) | (local_430.mask1 & uVar1) * 2) ^
       local_430.hasher.hashvalues[(byte)local_480._M_current[3]];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hash value of ABCD is ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_448,local_480,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_480._M_current + 4),(allocator_type *)&local_460);
  if (local_440 == local_448) {
    uVar1 = 0;
  }
  else {
    uVar5 = 0;
    uVar1 = 0;
    do {
      uVar1 = (uVar1 >> ((char)local_430.wordsize - 1U & 0x1f) | (uVar1 & local_430.mask1) * 2) ^
              local_430.hasher.hashvalues[*(byte *)((long)local_448 + uVar5)];
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)((long)local_440 - (long)local_448));
  }
  if (uVar1 != local_430.hashvalue) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"bug");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_430.hashvalue =
       (local_430.hashvalue >> ((char)local_430.wordsize - 1U & 0x1f) |
       (local_430.mask1 & local_430.hashvalue) * 2) ^
       local_430.hasher.hashvalues[(byte)local_480._M_current[4]];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hash value of ABCDE is ",0x17);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_460,local_480,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_480._M_current + local_478),&local_481);
  if (local_458 == local_460) {
    uVar1 = 0;
  }
  else {
    uVar5 = 0;
    uVar1 = 0;
    do {
      uVar1 = (uVar1 >> ((char)local_430.wordsize - 1U & 0x1f) | (uVar1 & local_430.mask1) * 2) ^
              local_430.hasher.hashvalues[*(byte *)((long)local_460 + uVar5)];
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)((long)local_458 - (long)local_460));
  }
  if (uVar1 != local_430.hashvalue) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"bug");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_460 != (void *)0x0) {
    operator_delete(local_460);
  }
  if (local_448 != (void *)0x0) {
    operator_delete(local_448);
  }
  if ((byte *)local_480._M_current != local_470) {
    operator_delete(local_480._M_current);
  }
  return 0;
}

Assistant:

int main() {
  CyclicHash<> hf(5, 19);
  string input = "ABCDE";
  hf.eat(input[0]); // A
  hf.eat(input[1]); // B
  hf.eat(input[2]); // C
  hf.eat(input[3]); // D
  cout << "Hash value of ABCD is " << hf.hashvalue << endl;
  // we check the answer going the long way...
  const std::vector<unsigned char> charvectslice(input.begin(),
                                                 input.begin() + 4);
  uint32_t trueanswerslice = hf.hash(charvectslice);
  if (trueanswerslice != hf.hashvalue)
    throw runtime_error("bug");
  // we continue
  hf.eat(input[4]); // E
  cout << "Hash value of ABCDE is " << hf.hashvalue << endl;
  // we check the answer going the long way
  const std::vector<unsigned char> charvect(input.begin(), input.end());
  uint32_t trueanswer = hf.hash(charvect);
  if (trueanswer != hf.hashvalue)
    throw runtime_error("bug");
  return 0;
}